

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

BOOL __thiscall
Js::CustomExternalWrapperObject::EnsureInitialized
          (CustomExternalWrapperObject *this,ScriptContext *requestContext)

{
  Var aValue;
  anon_class_24_3_b56ecbc3 implicitCall;
  bool bVar1;
  ThreadContext *this_00;
  CustomExternalWrapperType *this_01;
  JsGetterSetterInterceptor *pJVar2;
  void **ppvVar3;
  JavascriptFunction *function;
  RecyclableObject *targetObj;
  JavascriptFunction *initializeMethod;
  void *initializeTrap;
  ThreadContext *threadContext;
  ScriptContext *requestContext_local;
  CustomExternalWrapperObject *this_local;
  
  this_00 = ScriptContext::GetThreadContext(requestContext);
  if ((this->initialized & 1U) == 0) {
    this_01 = GetExternalType(this);
    pJVar2 = CustomExternalWrapperType::GetJsGetterSetterInterceptor(this_01);
    ppvVar3 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&pJVar2->initializeTrap);
    aValue = *ppvVar3;
    if (aValue == (Var)0x0) {
      this_local._4_4_ = 1;
    }
    else {
      bVar1 = ThreadContext::IsDisableImplicitCall(this_00);
      if (bVar1) {
        ThreadContext::AddImplicitCallFlags(this_00,ImplicitCall_External);
        this_local._4_4_ = 0;
      }
      else {
        this->initialized = true;
        function = VarTo<Js::JavascriptFunction>(aValue);
        implicitCall.initializeMethod = function;
        implicitCall.threadContext = this_00;
        implicitCall.targetObj = (RecyclableObject *)this;
        ThreadContext::
        ExecuteImplicitCall<Js::CustomExternalWrapperObject::EnsureInitialized(Js::ScriptContext*)::__0>
                  (this_00,(RecyclableObject *)function,ImplicitCall_Accessor,implicitCall);
        this_local._4_4_ = 1;
      }
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL CustomExternalWrapperObject::EnsureInitialized(ScriptContext* requestContext)
{
    ThreadContext* threadContext = requestContext->GetThreadContext();
    if (this->initialized)
    {
        return TRUE;
    }
    void* initializeTrap = this->GetExternalType()->GetJsGetterSetterInterceptor()->initializeTrap;
    if (initializeTrap == nullptr)
    {
        return TRUE;
    }
    if (threadContext->IsDisableImplicitCall())
    {
        threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
        return FALSE;
    }

    this->initialized = true;
    JavascriptFunction * initializeMethod = Js::VarTo<JavascriptFunction>(initializeTrap);

    Js::RecyclableObject * targetObj = this;
    threadContext->ExecuteImplicitCall(initializeMethod, Js::ImplicitCall_Accessor, [=]()->Js::Var
    {
        return CALL_FUNCTION(threadContext, initializeMethod, Js::CallInfo(Js::CallFlags_Value, 1), targetObj);
    });
    return TRUE;
}